

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USBAnalyzerResults.cpp
# Opt level: O3

void __thiscall
USBAnalyzerResults::GenerateExportFileBytes
          (USBAnalyzerResults *this,char *file,DisplayBase display_base)

{
  char cVar1;
  uint uVar2;
  ulonglong uVar3;
  ulonglong uVar4;
  size_t sVar5;
  ostream *poVar6;
  ulonglong uVar7;
  Frame f;
  ofstream file_stream;
  char time_str [128];
  string local_310;
  undefined2 local_2f0;
  char *local_2e8;
  size_type sStack_2e0;
  U64 local_2d8;
  undefined8 uStack_2d0;
  undefined2 local_2c8;
  long local_2b8;
  filebuf local_2b0 [240];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  std::ofstream::ofstream(&local_2b8,file,_S_out);
  uVar3 = Analyzer::GetTriggerSample();
  uVar2 = Analyzer::GetSampleRate();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,"Time [s],Byte",0xd);
  std::ios::widen((char)(ostream *)&local_2b8 + (char)*(undefined8 *)(local_2b8 + -0x18));
  std::ostream::put((char)&local_2b8);
  std::ostream::flush();
  Frame::Frame((Frame *)&local_2e8);
  local_b8[0] = '\0';
  uVar4 = AnalyzerResults::GetNumFrames();
  if (uVar4 != 0) {
    uVar7 = 0;
    do {
      AnalyzerResults::GetFrame((ulonglong)&local_310);
      local_2c8 = local_2f0;
      local_2d8 = local_310.field_2._M_allocated_capacity;
      uStack_2d0 = local_310.field_2._8_8_;
      local_2e8 = local_310._M_dataplus._M_p;
      sStack_2e0 = local_310._M_string_length;
      Frame::~Frame((Frame *)&local_310);
      cVar1 = AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar7);
      if (cVar1 != '\0') goto LAB_001320c7;
      if ((char)local_2c8 == '\v') {
        AnalyzerHelpers::GetTimeString((ulonglong)local_2e8,uVar3,uVar2,local_b8,0x80);
        sVar5 = strlen(local_b8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,local_b8,sVar5);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_2b8,",",1);
        int2str_sal_abi_cxx11_(&local_310,local_2d8,display_base,8);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_2b8,local_310._M_dataplus._M_p,
                            local_310._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_310._M_dataplus._M_p != &local_310.field_2) {
          operator_delete(local_310._M_dataplus._M_p);
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar4 != uVar7);
  }
  AnalyzerResults::UpdateExportProgressAndCheckForCancel((ulonglong)this,uVar4);
LAB_001320c7:
  Frame::~Frame((Frame *)&local_2e8);
  local_2b8 = _VTT;
  *(undefined8 *)(local_2b0 + *(long *)(_VTT + -0x18) + -8) = __Frame;
  std::filebuf::~filebuf(local_2b0);
  std::ios_base::~ios_base(local_1c0);
  return;
}

Assistant:

void USBAnalyzerResults::GenerateExportFileBytes( const char* file, DisplayBase display_base )
{
    std::ofstream file_stream( file, std::ios::out );

    U64 trigger_sample = mAnalyzer->GetTriggerSample();
    U32 sample_rate = mAnalyzer->GetSampleRate();

    // header
    file_stream << "Time [s],Byte" << std::endl;

    Frame f;
    char time_str[ 128 ];
    time_str[ 0 ] = '\0';
    const U64 num_frames = GetNumFrames();
    for( U64 fcnt = 0; fcnt < num_frames; fcnt++ )
    {
        // get the frame
        f = GetFrame( fcnt );

        if( UpdateExportProgressAndCheckForCancel( fcnt, num_frames ) )
            return;

        // start of a new packet?
        if( f.mType == FT_Byte )
        {
            // make the time string
            AnalyzerHelpers::GetTimeString( f.mStartingSampleInclusive, trigger_sample, sample_rate, time_str, sizeof( time_str ) );

            // output byte and timestamp
            file_stream << time_str << "," << int2str_sal( f.mData1, display_base, 8 ) << std::endl;
        }
    }

    // end
    UpdateExportProgressAndCheckForCancel( num_frames, num_frames );
}